

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O0

void encode_minimalExample_isSuccessful(void)

{
  bech32_error bVar1;
  int iVar2;
  size_t hrplen;
  bech32_bstring *bstring_00;
  bech32_bstring *bstring;
  char expected [9];
  uchar dp [1];
  char hrp [2];
  
  expected[2] = 'a';
  expected[3] = '\0';
  memset(expected + 1,0,1);
  stack0xffffffffffffffec = 0x61336e66716c3161;
  expected[0] = '\0';
  hrplen = strlen(expected + 2);
  bstring_00 = bech32_create_bstring(hrplen,0);
  bVar1 = bech32_encode(bstring_00,expected + 2,(uchar *)(expected + 1),0);
  if (bVar1 != E_BECH32_SUCCESS) {
    __assert_fail("bech32_encode(bstring, hrp, dp, 0) == E_BECH32_SUCCESS",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x10f,"void encode_minimalExample_isSuccessful(void)");
  }
  iVar2 = strcmp((char *)((long)&bstring + 4),bstring_00->string);
  if (iVar2 == 0) {
    bech32_free_bstring(bstring_00);
    return;
  }
  __assert_fail("strcmp(expected, bstring->string) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x110,"void encode_minimalExample_isSuccessful(void)");
}

Assistant:

void encode_minimalExample_isSuccessful(void) {
    char hrp[] = "a";
    unsigned char dp[] = {0}; // C doesn't allow zero-length arrays
    char expected[] = "a1lqfn3a";
    bech32_bstring *bstring = bech32_create_bstring(strlen(hrp), 0);

    assert(bech32_encode(bstring, hrp, dp, 0) == E_BECH32_SUCCESS);
    assert(strcmp(expected, bstring->string) == 0);

    bech32_free_bstring(bstring);
}